

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_layouts
          (Impl *this,StateCreatorInterface *iface,Value *layouts)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  VkPipelineLayoutCreateInfo *pVVar4;
  Pointer pVVar5;
  Ch *str;
  size_type sVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar7;
  VkPipelineLayoutCreateInfo *pVVar8;
  Type pGVar9;
  mapped_type *ppVVar10;
  VkPipelineLayoutCreateInfo *info;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  Hash hash;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_40;
  ConstMemberIterator itr;
  uint index;
  VkPipelineLayoutCreateInfo *infos;
  Value *layouts_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberCount(layouts);
  pVVar4 = ScratchAllocator::allocate_n_cleared<VkPipelineLayoutCreateInfo>
                     (&this->allocator,(ulong)SVar2);
  itr.ptr_._4_4_ = 0;
  local_40.ptr_ =
       (Pointer)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberBegin(layouts);
  do {
    hash = (Hash)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(layouts);
    bVar1 = rapidjson::
            GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator!=((GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&local_40,
                         (GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&hash);
    if (!bVar1) {
      (*iface->_vptr_StateCreatorInterface[0x11])();
      return true;
    }
    pVVar5 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator->(&local_40);
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(&pVVar5->name);
    obj = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *)string_to_uint64(str);
    sVar6 = std::
            unordered_map<unsigned_long,_VkPipelineLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>_>
            ::count(&this->replayed_pipeline_layouts,(key_type *)&obj);
    if (sVar6 == 0) {
      pVVar5 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(&local_40);
      pGVar7 = &pVVar5->value;
      pVVar8 = pVVar4 + itr.ptr_._4_4_;
      pVVar8->sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pGVar7,"flags");
      uVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar9);
      pVVar8->flags = uVar3;
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(pGVar7,"pushConstantRanges");
      if (bVar1) {
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)pGVar7,"pushConstantRanges");
        SVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar9);
        pVVar8->pushConstantRangeCount = SVar2;
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)pGVar7,"pushConstantRanges");
        bVar1 = parse_push_constant_ranges(this,pGVar9,&pVVar8->pPushConstantRanges);
        if (!bVar1) {
          return false;
        }
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(pGVar7,"setLayouts");
      if (bVar1) {
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)pGVar7,"setLayouts");
        SVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar9);
        pVVar8->setLayoutCount = SVar2;
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)pGVar7,"setLayouts");
        bVar1 = parse_set_layouts(this,pGVar9,&pVVar8->pSetLayouts);
        if (!bVar1) {
          return false;
        }
      }
      pGVar7 = obj;
      ppVVar10 = std::
                 unordered_map<unsigned_long,_VkPipelineLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>_>
                 ::operator[](&this->replayed_pipeline_layouts,(key_type *)&obj);
      uVar3 = (*iface->_vptr_StateCreatorInterface[7])(iface,pGVar7,pVVar8,ppVVar10);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++(&local_40);
    itr.ptr_._4_4_ = itr.ptr_._4_4_ + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_layouts(StateCreatorInterface &iface, const Value &layouts)
{
	auto *infos = allocator.allocate_n_cleared<VkPipelineLayoutCreateInfo>(layouts.MemberCount());

	unsigned index = 0;
	for (auto itr = layouts.MemberBegin(); itr != layouts.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_pipeline_layouts.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;

		info.flags = obj["flags"].GetUint();

		if (obj.HasMember("pushConstantRanges"))
		{
			info.pushConstantRangeCount = obj["pushConstantRanges"].Size();
			if (!parse_push_constant_ranges(obj["pushConstantRanges"], &info.pPushConstantRanges))
				return false;
		}

		if (obj.HasMember("setLayouts"))
		{
			info.setLayoutCount = obj["setLayouts"].Size();
			if (!parse_set_layouts(obj["setLayouts"], &info.pSetLayouts))
				return false;
		}

		if (!iface.enqueue_create_pipeline_layout(hash, &info, &replayed_pipeline_layouts[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}